

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmTextureCalc::ExpandHeight
          (GmmTextureCalc *this,uint32_t Height,uint32_t UnitAlignment,uint32_t NumSamples)

{
  uint32_t uVar1;
  uint32_t NumSamples_00;
  
  uVar1 = 4;
  if (NumSamples != 8) {
    uVar1 = NumSamples;
  }
  NumSamples_00 = 1;
  if (NumSamples != 2) {
    NumSamples_00 = uVar1;
  }
  uVar1 = ExpandWidth(this,Height,UnitAlignment,NumSamples_00);
  return uVar1;
}

Assistant:

uint32_t GmmLib::GmmTextureCalc::ExpandHeight(uint32_t Height, uint32_t UnitAlignment, uint32_t NumSamples)
{
    // Implemented as separate function (instead of as a single function with a
    // Width/Height parameter) so both functions can be later implemented without
    // branches, if need be.

    return (
    GmmLib::GmmTextureCalc::ExpandWidth(
    Height, UnitAlignment,
    (NumSamples == 2) ? 1 :                 // MSAA_2X: No height adjustment
    ((NumSamples == 8) ? 4 : NumSamples))); // <-- MSAA_8X:Height = MSAA_4X:Height.
}